

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bareNEST.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  VDetector *detector;
  RandomGen *pRVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  int Ne;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double extraout_XMM0_Qa;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  long lStackY_430;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d0;
  double local_3c8;
  vector<double,_std::allocator<double>_> scint2;
  undefined4 local_3a8;
  vector<double,_std::allocator<double>_> vTable;
  vector<double,_std::allocator<double>_> wf_amp;
  double dStack_360;
  vector<double,_std::allocator<double>_> scint;
  vector<long,_std::allocator<long>_> wf_time;
  vector<double,_std::allocator<double>_> g2_params;
  QuantaResult quanta;
  YieldResult yields;
  NESTcalc n;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "NOTE: This is a skeleton code meant to be a starting point for custom uses of NEST. But you should really look at execNEST."
                          );
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  detector = (VDetector *)operator_new(0x128);
  DetectorExample_LUX_RUN03::DetectorExample_LUX_RUN03((DetectorExample_LUX_RUN03 *)detector);
  NEST::NESTcalc::NESTcalc(&n,detector);
  pRVar4 = RandomGen::rndm();
  RandomGen::SetSeed(pRVar4,0);
  vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pRVar4 = RandomGen::rndm();
  local_3f8 = RandomGen::rand_uniform(pRVar4);
  dVar6 = NEST::NESTcalc::SetDensity(&n,detector->T_Kelvin,detector->p_bar);
  if (dVar6 < 1.0) {
    detector->inGas = true;
  }
  NEST::NESTcalc::CalculateG2(&g2_params,&n,1);
  dVar1 = g2_params.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  NEST::NESTcalc::SetDriftVelocity_NonUniform
            (&wf_amp,&n,dVar6,z_step,detector->T_Kelvin,detector->p_bar,in_XMM4_Qa,in_XMM5_Qa);
  uVar15 = 0;
  uVar16 = 0x40240000;
  dVar7 = local_3f8 * 90.0 + 10.0;
  dVar11 = 100.0;
  if (dVar7 <= 100.0) {
    dVar11 = dVar7;
  }
  if (10.0 <= dVar11) {
    uVar15 = SUB84(dVar11,0);
    uVar16 = (undefined4)((ulong)dVar11 >> 0x20);
  }
  local_3e8 = (double)CONCAT44(uVar16,uVar15);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&vTable,&wf_amp.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wf_amp.super__Vector_base<double,_std::allocator<double>_>);
  dVar7 = floor(((detector->gate + -100.0 + detector->cathode + 1.5) * 0.5) / z_step + 0.5);
  dVar7 = vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_start[(int)dVar7];
  dVar11 = -999.0;
  do {
    if (detector->dt_min <= dVar11) {
      local_3e0 = detector->TopDrift;
      if ((0.0 < local_400) && (dVar11 < detector->dt_max || dVar11 == detector->dt_max)) {
        if (local_400 <= local_3e0) {
          NEST::NESTcalc::GetYields
                    ((YieldResult *)&wf_amp,&n,NR,local_3e8,dVar6,local_3f8,0.0,0.0,
                     &default_NRYieldsParam,&default_ERYieldsParam);
          yields.ExcitonRatio =
               (double)wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          yields.Lindhard = dStack_360;
          yields.PhotonYield =
               (double)wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          yields.ElectronYield =
               (double)wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          NEST::NESTcalc::GetQuanta
                    ((QuantaResult *)&wf_amp,&n,&yields,dVar6,&default_NRERWidthsParam,-999.0);
          quanta.recombProb =
               (double)wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          quanta._0_8_ = wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
          quanta._8_8_ = wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          exp(-dVar11 / detector->eLife_us);
          wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          wf_time.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          wf_amp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          wf_time.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          wf_time.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          pvVar5 = NEST::NESTcalc::GetS1
                             (&n,&quanta,local_3f0,local_3d0,local_400,local_3f0,local_3d0,local_400
                              ,local_3c8,dVar7,NR,0,local_3f8,local_3e8,s1CalculationMode,verbosity,
                              &wf_time,&wf_amp);
          std::vector<double,_std::allocator<double>_>::vector(&scint,pvVar5);
          if (detector->cathode <= local_400) {
            Ne = quanta.electrons;
          }
          else {
            quanta._0_8_ = quanta._0_8_ & 0xffffffff;
            Ne = 0;
          }
          pvVar5 = NEST::NESTcalc::GetS2
                             (&n,Ne,local_3f0,local_3d0,local_400,local_3f0,local_3d0,local_400,
                              dVar11,local_3c8,0,local_3f8,s2CalculationMode,verbosity,&wf_time,
                              &wf_amp,&g2_params);
          std::vector<double,_std::allocator<double>_>::vector(&scint2,pvVar5);
          if (MCtruthE == false) {
            if (usePD == 0) {
              dVar6 = detector->P_dphe + 1.0;
              auVar12._0_8_ =
                   ABS(scint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[3]);
              auVar12._8_8_ =
                   ABS(scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[5]);
              dVar1 = dVar6 * dVar1;
              auVar14._8_4_ = SUB84(dVar1,0);
              auVar14._0_8_ = dVar6 * detector->g1;
              auVar14._12_4_ = (int)((ulong)dVar1 >> 0x20);
              auVar14 = divpd(auVar12,auVar14);
            }
            else {
              if (usePD == 1) {
                lStackY_430 = 0x28;
              }
              else {
                lStackY_430 = 0x38;
              }
              auVar13._0_8_ =
                   *(ulong *)((long)scint.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lStackY_430) &
                   0x7fffffffffffffff;
              auVar13._8_8_ =
                   ABS(scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[7]);
              auVar2._8_4_ = SUB84(dVar1,0);
              auVar2._0_8_ = detector->g1;
              auVar2._12_4_ = (int)((ulong)dVar1 >> 0x20);
              auVar14 = divpd(auVar13,auVar2);
            }
            local_3e8 = 0.0;
            if (((0.0 < auVar14._0_8_) && (2.2250738585072014e-308 < yields.Lindhard)) &&
               (0.0 < auVar14._8_8_)) {
              local_3e8 = ((auVar14._0_8_ + auVar14._8_8_) * 13.4 * 0.001) / yields.Lindhard;
            }
          }
          fwrite("\nE [keV]\t\tfield [V/cm]\ttDrift [us]\tX,Y,Z [mm]\tNph\tNe-\tS1 [PE or phe]\tS1_3Dcor [phd]\tS1c_spike\tNe-Extr\tS2_rawArea [PE]\tS2_3Dcorr [phd]\n"
                 ,0x86,1,_stdout);
          local_3a8 = SUB84(dVar11,0);
          printf("%.6f\t%.6f\t%.6f\t%.0f, %.0f, %.0f\t%d\t%d\t",local_3e8,SUB84(local_3f8,0),
                 local_3a8,local_3f0,local_3d0,local_400,quanta._0_8_ & 0xffffffff,
                 (ulong)quanta._0_8_ >> 0x20);
          uVar15 = SUB84(scint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[5],0);
          if (((1000.0 < local_3e8) ||
              (maxS1 < scint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[5])) ||
             (maxS2 < scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[7])) {
            printf("%e\t%e\t%e\t",
                   scint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[2],uVar15,
                   SUB84(scint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[7],0));
            printf("%lli\t%e\t%e\n",
                   scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[4],
                   SUB84(scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[7],0),
                   (long)*scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
          }
          else {
            printf("%.6f\t%.6f\t%.6f\t",
                   scint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[2],uVar15,
                   SUB84(scint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[7],0));
            printf("%i\t%.6f\t%.6f\n",
                   scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[4],
                   SUB84(scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[7],0),
                   (ulong)(uint)(int)*scint2.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&scint2.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&scint.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                    (&wf_time.super__Vector_base<long,_std::allocator<long>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&wf_amp.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&g2_params.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&vTable.super__Vector_base<double,_std::allocator<double>_>);
          NEST::NESTcalc::~NESTcalc(&n);
          return 0;
        }
      }
    }
    else {
      local_3e0 = detector->TopDrift;
    }
    pRVar4 = RandomGen::rndm();
    dVar8 = RandomGen::rand_uniform(pRVar4);
    dVar11 = detector->radius;
    pRVar4 = RandomGen::rndm();
    dVar9 = RandomGen::rand_uniform(pRVar4);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    pRVar4 = RandomGen::rndm();
    dVar10 = RandomGen::rand_uniform(pRVar4);
    local_400 = local_3e0 * dVar8 + 0.0;
    dVar11 = dVar11 * dVar9;
    dVar8 = cos(dVar10 * 6.283185307179586);
    local_3f0 = dVar8 * dVar11;
    dVar8 = sin(dVar10 * 6.283185307179586);
    local_3d0 = dVar8 * dVar11;
    (*detector->_vptr_VDetector[4])(local_3f0,SUB84(local_3d0,0),SUB84(local_400,0),detector);
    dVar11 = floor(local_400 / z_step + 0.5);
    local_3c8 = vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(int)dVar11];
    dVar11 = (detector->TopDrift - local_400) / local_3c8;
    local_3f8 = extraout_XMM0_Qa;
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  double dayNum = 0.;
  // Give a message establishing the use of this code
  cerr << "NOTE: This is a skeleton code meant to be a starting point for "
          "custom uses of NEST. But you should really look at execNEST."
       << endl
       << endl;

  // Instantiate your own VDetector class here, then load into NEST class
  // constructor
  DetectorExample_LUX_RUN03* detector = new DetectorExample_LUX_RUN03();

  // Construct NEST class using detector object
  NEST::NESTcalc n(detector);

  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(0);

  // Construct NEST objects for storing calculation results
  NEST::YieldResult yields;
  NEST::QuantaResult quanta;

  // Declare needed temporary variables
  vector<double> vTable;
  int index;  // index for Z step (for getting pre-calculated drift field)
  double g2, pos_x, pos_y, pos_z, r, phi, driftTime, field, vD, vD_middle;
  // Energy min and max for source spectrum
  double eMin = 10;
  double eMax = 100;
  // For ion calculations
  double atomNum = 0, massNum = 0;
  // Only necessary for type_num == WIMP
  double wimp_mass_GeV = 1.;

  // Choose a possible interaction type
  INTERACTION_TYPE type_num = NR;
  // INTERACTION_TYPE type_num = WIMP;
  // INTERACTION_TYPE type_num = B8;
  // INTERACTION_TYPE type_num = DD;
  // INTERACTION_TYPE type_num = AmBe;
  // INTERACTION_TYPE type_num = Cf;
  // NOTE: For heavy nuclei or ions, ion requires specification of "atomNum" and
  // "massNum"
  // INTERACTION_TYPE type_num = ion;
  // INTERACTION_TYPE type_num = gammaRay;
  // INTERACTION_TYPE type_num = Kr83m;
  // INTERACTION_TYPE type_num = CH3T;
  // INTERACTION_TYPE type_num = C14;
  // INTERACTION_TYPE type_num = NEST::beta;

  // Do checks for special-case source spectra
  if (type_num == Kr83m) {
    if (eMin == 9.4 && eMax == 9.4) {
    } else if (eMin == 32.1 && eMax == 32.1) {
    } else {
      if (verbosity > 0)
        cerr << "ERROR: For Kr83m, put both energies as 9.4 or both as 32.1 "
                "keV please."
             << endl;
      return 1;
    }
  } else if (type_num == gammaRay && verbosity > 0) {
    if (eMin < 10. || eMax < 10.) {
      cerr << "WARNING: Typically beta model works better for ER BG at low "
              "energies as in a WS."
           << endl;
      cerr << "ER data is often best matched by a weighted average of the beta "
              "& gamma models."
           << endl;
    }
  }

  // Draw an event energy from the appropriate spectrum
  TestSpectra spec;
  double keV = -999.;
  if (eMin == eMax && eMin >= 0. && eMax > 0.)
    keV = eMin;
  else {
    switch (type_num) {
      case CH3T:
        keV = spec.CH3T_spectrum(eMin, eMax);
        break;
      case C14:
        keV = spec.C14_spectrum(eMin, eMax);
        break;
      case B8:  // normalize this to ~3500 / 10-ton / year, for E-threshold of
                // 0.5 keVnr, OR 180 evts/t/yr/keV at 1 keV
        keV = spec.B8_spectrum(eMin, eMax);
        break;
      case AmBe:  // for ZEPLIN-III FSR from HA (Pal '98)
        keV = spec.AmBe_spectrum(eMin, eMax);
        break;
      case Cf:
        keV = spec.Cf_spectrum(eMin, eMax);
        break;
      case DD:
        keV = spec.DD_spectrum(eMin, eMax, 10., 0.1, 60., 25., 0.);
        break;
      case WIMP:
        spec.wimp_spectrum_prep =
            spec.WIMP_prep_spectrum(wimp_mass_GeV, E_step, dayNum);
        keV =
            spec.WIMP_spectrum(spec.wimp_spectrum_prep, wimp_mass_GeV, dayNum);
        break;
      default:
        keV = eMin + (eMax - eMin) * RandomGen::rndm()->rand_uniform();
        break;
    }
  }

  // For most sources, ensure that the energy is in bounds
  if (type_num != WIMP && type_num != B8) {
    if (keV > eMax) keV = eMax;
    if (keV < eMin) keV = eMin;
  }

  // Calculate noble density based on temperature and pressure.
  // Use this to determine whether we are in gas phase
  double rho = n.SetDensity(detector->get_T_Kelvin(),
                            detector->get_p_bar());  // cout.precision(12);
  if (rho < 1.) detector->set_inGas(true);

  // Calculate and print g1, g2 parameters (once per detector)
  vector<double> g2_params = n.CalculateG2();
  g2 = g2_params.back();

  // Calculate a drift velocity table for non-uniform fields,
  // and calculate the drift velocity at detector center for normalization
  // purposes
  vTable = n.SetDriftVelocity_NonUniform(rho, z_step, detector->get_T_Kelvin(), detector->get_p_bar(), pos_x, pos_y);
  vD_middle = vTable[int(
      floor(.5 * (detector->get_gate() - 100. + detector->get_cathode() + 1.5) /
                z_step +
            0.5))];

  // Regenerate a random position for the event until the corresponding drift
  // time is within bounds (drift time uses the cumulative Z-dependent drift
  // velocity)
  driftTime = -999;
  while (driftTime < detector->get_dt_min() ||
         driftTime > detector->get_dt_max() || pos_z <= 0 ||
         pos_z > detector->get_TopDrift()) {
    pos_z = 0. +
            (detector->get_TopDrift() - 0.) * RandomGen::rndm()->rand_uniform();
    r = detector->get_radius() * sqrt(RandomGen::rndm()->rand_uniform());
    phi = 2. * M_PI * RandomGen::rndm()->rand_uniform();
    pos_x = r * cos(phi);
    pos_y = r * sin(phi);
    field = detector->FitEF(pos_x, pos_y, pos_z);
    index = int(floor(pos_z / z_step + 0.5));
    vD = vTable[index];
    driftTime =
        (detector->get_TopDrift() - pos_z) / vD;  // (mm - mm) / (mm / us) = us
  }

  // Get yields from NEST calculator, along with number of quanta
  yields =
      n.GetYields(type_num, keV, rho, field, double(massNum), double(atomNum),
                  default_NRYieldsParam, default_ERYieldsParam);
  quanta = n.GetQuanta(yields, rho, default_NRERWidthsParam, -999.);

  // Calculate S2 photons using electron lifetime correction
  double Nphd_S2 =
      g2 * quanta.electrons * exp(-driftTime / detector->get_eLife_us());

  // Vectors for saving times and amplitudes of waveforms (with
  // (S1/S2)CalculationMode set to "Waveform" and the verbosity >= 1 in
  // analysis.hh)
  vector<double> wf_amp;
  vector<int64_t> wf_time;

  double truthPos[3] = {pos_x, pos_y, pos_z};
  double smearPos[3] = {pos_x, pos_y, pos_z};

  // Calculate the S1 based on the quanta generated
  vector<double> scint =
      n.GetS1(quanta, truthPos[0], truthPos[1], truthPos[2], smearPos[0],
              smearPos[1], smearPos[2], vD, vD_middle, type_num, 0, field, keV,
              s1CalculationMode, verbosity, wf_time, wf_amp);

  // Take care of gamma-X case for positions below cathode
  if (truthPos[2] < detector->get_cathode()) quanta.electrons = 0;
  vector<double> scint2 =
      n.GetS2(quanta.electrons, truthPos[0], truthPos[1], truthPos[2],
              smearPos[0], smearPos[1], smearPos[2], driftTime, vD, 0, field,
              s2CalculationMode, verbosity, wf_time, wf_amp, g2_params);

  // If using the reconstructed energy, back-calculate energy as measured from
  // yields
  if (!MCtruthE) {
    double Nph, g1 = detector->get_g1(), Ne;
    if (usePD == 0)
      Nph = std::abs(scint[3]) / (g1 * (1. + detector->get_P_dphe()));
    else if (usePD == 1)
      Nph = std::abs(scint[5]) / g1;
    else
      Nph = std::abs(scint[7]) / g1;

    if (usePD == 0)
      Ne = std::abs(scint2[5]) / (g2 * (1. + detector->get_P_dphe()));
    else
      Ne = std::abs(scint2[7]) / g2;

    if (yields.Lindhard > DBL_MIN && Nph > 0. && Ne > 0.) {
      keV = (Nph + Ne) * W_DEFAULT * 1e-3 / yields.Lindhard;
    } else
      keV = 0.;
  }

  // Possible outputs from "scint" vector
  // scint[0] = nHits; // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  // scint[1] = Nphe; // MC-true integer hits WITH double phe effect (Nphe >
  // nHits)
  // scint[2] = pulseArea; // floating real# smeared DAQ pulse areas in phe, NO
  // XYZ correction
  // scint[3] = pulseAreaC; // smeared DAQ pulse areas in phe, WITH XYZ
  // correction
  // scint[4] = Nphd; // same as pulse area, adjusted/corrected *downward* for
  // 2-PE effect (LUX phd units)
  // scint[5] = NphdC; // same as Nphd, but XYZ-corrected
  // scint[6] = spike; // floating real# spike count, NO XYZ correction
  // scint[7] = spikeC; // floating real# spike count, WITH XYZ correction
  // scint[8] = fdetector->get_g1(); // g1 (light collection efficiency in
  // liquid)

  // Possible outputs from "scint2" vector
  // scint2[0] = Nee; // integer number of electrons unabsorbed in liquid then
  // getting extracted
  // scint2[1] = Nph; // raw number of photons produced in the gas gap
  // scint2[2] = nHits; // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  // scint2[3] = Nphe; // MC-true integer hits WITH double phe effect (Nphe >
  // nHits). S2 has more steps than S1 (e's 1st)
  //
  // If S2 threshold is set to positive (normal mode)
  // scint2[4] = pulseArea; // floating real# smeared DAQ pulse areas in phe, NO
  // XYZ correction
  // scint2[5] = pulseAreaC; // smeared DAQ pulse areas in phe, WITH XYZ
  // correction
  // scint2[6] = Nphd; // same as pulse area, adjusted/corrected *downward* for
  // 2-PE effect (LUX phd units)
  // scint2[7] = NphdC; // same as Nphd, but XYZ-corrected
  //
  // If S2 threshold is set to negative (switches from S2 -> S2 bottom, NOT
  // literally negative)
  // scint2[4] = S2b; // floating real# smeared pulse areas in phe ONLY
  // including bottom PMTs, NO XYZ correction
  // scint2[5] = S2bc; // floating real# smeared pulse areas in phe ONLY
  // including bottom PMTs, WITH XYZ correction
  // scint2[6] = S2b / (1.+fdetector->get_P_dphe()); // same as S2b, but
  // adjusted for 2-PE effect (LUX phd units)
  // scint2[7] = S2bc / (1.+fdetector->get_P_dphe()); // same as S2bc, but
  // adjusted for 2-PE effect (LUX phd units)
  // scint2[8] = g2; // g2 = ExtEff * SE, light collection efficiency of EL in
  // gas gap (from CalculateG2)

  // Print selected outputs a la execNEST
  fprintf(
      stdout,
      "\nE [keV]\t\tfield [V/cm]\ttDrift [us]\tX,Y,Z [mm]\tNph\tNe-\tS1 [PE "
      "or phe]\tS1_3Dcor [phd]\tS1c_spike\tNe-Extr\tS2_rawArea "
      "[PE]\tS2_3Dcorr [phd]\n");
  printf("%.6f\t%.6f\t%.6f\t%.0f, %.0f, %.0f\t%d\t%d\t", keV, field, driftTime,
         truthPos[0], truthPos[1], truthPos[2], quanta.photons,
         quanta.electrons);  // comment this out when below line in
  // If energy > 1 MeV, switch output notation
  if (keV > 1000. || scint[5] > maxS1 || scint2[7] > maxS2) {
    printf("%e\t%e\t%e\t", scint[2], scint[5], scint[7]);
    printf("%lli\t%e\t%e\n", (long long int)scint2[0], scint2[4], scint2[7]);
  } else {
    printf("%.6f\t%.6f\t%.6f\t", scint[2], scint[5],
           scint[7]);  // see GetS1 inside of NEST.cpp for full explanation of
                       // all 8 scint return vector elements. Sample 3 most
                       // common
    printf("%i\t%.6f\t%.6f\n", (int)scint2[0], scint2[4],
           scint2[7]);  // see GetS2 inside of NEST.cpp for full explanation of
                        // all 8 scint2 vector elements. Change as you desire
  }

  return 0;
}